

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::Format<std::__cxx11::string,unsigned_long>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   unsigned_long params_1)

{
  string *in_RDX;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  string local_40 [56];
  string *params_1_00;
  
  params_1_00 = in_RDI;
  ::std::__cxx11::string::string(local_40,in_RDX);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long>
            (in_stack_00000008,unaff_retaddr,(unsigned_long)params_1_00);
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}